

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Performance::InvalidShaderCompilerCase::logProgramData
          (InvalidShaderCompilerCase *this,BuildInfo *buildInfo,ProgramContext *progCtx)

{
  TestLog *pTVar1;
  LogShader local_120;
  LogShader local_d0;
  allocator<char> local_69;
  string local_68;
  LogShaderProgram local_48;
  ProgramContext *local_20;
  ProgramContext *progCtx_local;
  BuildInfo *buildInfo_local;
  InvalidShaderCompilerCase *this_local;
  
  local_20 = progCtx;
  progCtx_local = (ProgramContext *)buildInfo;
  buildInfo_local = (BuildInfo *)this;
  pTVar1 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"(No linking done)",&local_69);
  tcu::LogShaderProgram::LogShaderProgram(&local_48,false,&local_68);
  pTVar1 = tcu::TestLog::operator<<(pTVar1,&local_48);
  tcu::LogShader::LogShader
            (&local_d0,QP_SHADER_TYPE_VERTEX,&local_20->vertShaderSource,
             (bool)((byte)(progCtx_local->vertShaderSource)._M_dataplus & 1),
             (string *)&(progCtx_local->vertShaderSource)._M_string_length);
  pTVar1 = tcu::TestLog::operator<<(pTVar1,&local_d0);
  tcu::LogShader::LogShader
            (&local_120,QP_SHADER_TYPE_FRAGMENT,&local_20->fragShaderSource,
             (bool)((progCtx_local->vertShaderSource).field_0x1 & 1),
             (string *)&(progCtx_local->fragShaderSource)._M_string_length);
  pTVar1 = tcu::TestLog::operator<<(pTVar1,&local_120);
  tcu::TestLog::operator<<(pTVar1,(EndShaderProgramToken *)&tcu::TestLog::EndShaderProgram);
  tcu::LogShader::~LogShader(&local_120);
  tcu::LogShader::~LogShader(&local_d0);
  tcu::LogShaderProgram::~LogShaderProgram(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

void InvalidShaderCompilerCase::logProgramData (const BuildInfo& buildInfo, const ProgramContext& progCtx) const
{
	m_testCtx.getLog() << TestLog::ShaderProgram(false, "(No linking done)")
					   << TestLog::Shader(QP_SHADER_TYPE_VERTEX,	progCtx.vertShaderSource, buildInfo.vertCompileSuccess, buildInfo.logs.vert)
					   << TestLog::Shader(QP_SHADER_TYPE_FRAGMENT,	progCtx.fragShaderSource, buildInfo.fragCompileSuccess, buildInfo.logs.frag)
					   << TestLog::EndShaderProgram;
}